

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprNodeNext_TERM(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5Iter *pIter_00;
  Fts5ExprPhrase *pFVar1;
  Fts5IndexIter *pFVar2;
  int iVar3;
  uint uVar4;
  Fts5Iter *pIter;
  
  pIter_00 = (Fts5Iter *)pNode->pNear->apPhrase[0]->aTerm[0].pIter;
  if (bFromValid == 0) {
    fts5MultiIterNext(pIter_00->pIndex,pIter_00,0,0);
    iVar3 = pIter_00->pIndex->rc;
    pIter_00->pIndex->rc = 0;
  }
  else {
    iVar3 = sqlite3Fts5IterNextFrom((Fts5IndexIter *)pIter_00,iFrom);
  }
  if ((iVar3 == 0) && ((pIter_00->base).bEof == '\0')) {
    pFVar1 = pNode->pNear->apPhrase[0];
    pFVar2 = pFVar1->aTerm[0].pIter;
    iVar3 = pFVar2->nData;
    (pFVar1->poslist).n = iVar3;
    if (pExpr->pConfig->eDetail == 0) {
      (pFVar1->poslist).p = pFVar2->pData;
    }
    pNode->iRowid = pFVar2->iRowid;
    uVar4 = (uint)(iVar3 == 0);
    iVar3 = 0;
  }
  else {
    pNode->bEof = 1;
    uVar4 = 0;
  }
  pNode->bNomatch = uVar4;
  return iVar3;
}

Assistant:

static int fts5ExprNodeNext_TERM(
  Fts5Expr *pExpr, 
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc;
  Fts5IndexIter *pIter = pNode->pNear->apPhrase[0]->aTerm[0].pIter;

  assert( pNode->bEof==0 );
  if( bFromValid ){
    rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
  }else{
    rc = sqlite3Fts5IterNext(pIter);
  }
  if( rc==SQLITE_OK && sqlite3Fts5IterEof(pIter)==0 ){
    rc = fts5ExprNodeTest_TERM(pExpr, pNode);
  }else{
    pNode->bEof = 1;
    pNode->bNomatch = 0;
  }
  return rc;
}